

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudioFX_reverb.c
# Opt level: O0

void FAudioFXReverb_Process
               (FAudioFXReverb *fapo,uint32_t InputProcessParameterCount,
               FAPOProcessBufferParameters *pInputProcessParameters,
               uint32_t OutputProcessParameterCount,
               FAPOProcessBufferParameters *pOutputProcessParameters,int32_t IsEnabled)

{
  int iVar1;
  undefined8 uVar2;
  uint8_t uVar3;
  undefined4 in_ECX;
  FAudioFXReverbParameters9 *in_RDX;
  undefined4 in_ESI;
  FAPOBase *in_RDI;
  float *in_R8;
  int in_R9D;
  DspReverb *unaff_retaddr;
  float total;
  uint8_t update_params;
  FAudioFXReverbParameters *params;
  float local_40;
  size_t in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff0;
  
  uVar3 = FAPOBase_ParametersChanged(in_RDI);
  if (in_R9D == 0) {
    in_R8[2] = *(float *)&in_RDX->ReverbDelay;
    if (in_R8[2] != 0.0) {
      FAudioFXReverb_CopyBuffer
                ((FAudioFXReverb *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),in_R8,
                 (float *)(ulong)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    }
  }
  else {
    iVar1._0_1_ = in_RDX->ReverbDelay;
    iVar1._1_1_ = in_RDX->RearDelay;
    iVar1._2_1_ = in_RDX->SideDelay;
    iVar1._3_1_ = in_RDX->PositionLeft;
    if (iVar1 == 0) {
      uVar2._0_4_ = in_RDX->WetDryMix;
      uVar2._4_4_ = in_RDX->ReflectionsDelay;
      SDL_memset(uVar2,0,*(int *)&in_RDX->PositionRight * (uint)*(ushort *)&in_RDI[1].base.Release);
    }
    FAPOBase_BeginProcess(in_RDI);
    if (uVar3 != '\0') {
      if (*(char *)((long)&in_RDI[1].base.Release + 4) == '\t') {
        DspReverb_SetParameters9((DspReverb *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX);
      }
      else {
        DspReverb_SetParameters((DspReverb *)params,_total);
      }
    }
    iVar1 = *(int *)((long)&in_RDI[1].base.CalcOutputFrames + 4);
    if (iVar1 == 1) {
      local_40 = DspReverb_INTERNAL_Process_1_to_1
                           ((DspReverb *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                            &in_RDX->WetDryMix,(float *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
                            (size_t)in_R8);
    }
    else if (iVar1 == 2) {
      local_40 = DspReverb_INTERNAL_Process_2_to_2
                           ((DspReverb *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                            &in_RDX->WetDryMix,(float *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
                            (size_t)in_R8);
    }
    else if (*(int *)&in_RDI[1].base.CalcOutputFrames == 1) {
      local_40 = DspReverb_INTERNAL_Process_1_to_5p1
                           (unaff_retaddr,(float *)in_RDI,
                            (float *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(size_t)in_RDX);
    }
    else if (*(int *)&in_RDI[1].base.CalcOutputFrames == 2) {
      local_40 = DspReverb_INTERNAL_Process_2_to_5p1
                           (unaff_retaddr,(float *)in_RDI,
                            (float *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(size_t)in_RDX);
    }
    else {
      local_40 = DspReverb_INTERNAL_Process_5p1_to_5p1
                           (unaff_retaddr,(float *)in_RDI,
                            (float *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(size_t)in_RDX);
    }
    in_R8[2] = (float)(uint)(1e-07 <= local_40);
    FAPOBase_EndProcess(in_RDI);
  }
  return;
}

Assistant:

void FAudioFXReverb_Process(
	FAudioFXReverb *fapo,
	uint32_t InputProcessParameterCount,
	const FAPOProcessBufferParameters* pInputProcessParameters,
	uint32_t OutputProcessParameterCount,
	FAPOProcessBufferParameters* pOutputProcessParameters,
	int32_t IsEnabled
) {
	FAudioFXReverbParameters *params;
	uint8_t update_params = FAPOBase_ParametersChanged(&fapo->base);
	float total;
	
	/* Handle disabled filter */
	if (IsEnabled == 0)
	{
		pOutputProcessParameters->BufferFlags = pInputProcessParameters->BufferFlags;

		if (pOutputProcessParameters->BufferFlags != FAPO_BUFFER_SILENT)
		{
			FAudioFXReverb_CopyBuffer(
				fapo,
				(float*) pInputProcessParameters->pBuffer,
				(float*) pOutputProcessParameters->pBuffer,
				pInputProcessParameters->ValidFrameCount
			);
		}

		return;
	}
	
	/* XAudio2 passes a 'silent' buffer when no input buffer is available to play the effect tail */
	if (pInputProcessParameters->BufferFlags == FAPO_BUFFER_SILENT)
	{
		/* Make sure input data is usable. FIXME: Is this required? */
		FAudio_zero(
			pInputProcessParameters->pBuffer,
			pInputProcessParameters->ValidFrameCount * fapo->inBlockAlign
		);
	}

	params = (FAudioFXReverbParameters*) FAPOBase_BeginProcess(&fapo->base);

	/* Update parameters  */
	if (update_params)
	{
		if (fapo->apiVersion == 9)
		{
			DspReverb_SetParameters9(
				&fapo->reverb,
				(FAudioFXReverbParameters9*) params
			);
		}
		else
		{
			DspReverb_SetParameters(&fapo->reverb, params);
		}
	}

	/* Run reverb effect */
	#define PROCESS(pin, pout) \
		DspReverb_INTERNAL_Process_##pin##_to_##pout( \
			&fapo->reverb, \
			(float*) pInputProcessParameters->pBuffer, \
			(float*) pOutputProcessParameters->pBuffer, \
			pInputProcessParameters->ValidFrameCount * fapo->inChannels \
		)
	switch (fapo->reverb.out_channels)
	{
		case 1:
			total = PROCESS(1, 1);
			break;
		case 2:
			total = PROCESS(2, 2);
			break;
		default: /* 5.1 */
			if (fapo->reverb.in_channels == 1)
			{
				total = PROCESS(1, 5p1);
			}
			else if (fapo->reverb.in_channels == 2)
			{
				total = PROCESS(2, 5p1);
			}
			else /* 5.1 */
			{
				total = PROCESS(5p1, 5p1);
			}
			break;
	}
	#undef PROCESS

	/* Set BufferFlags to silent so PLAY_TAILS knows when to stop */
	pOutputProcessParameters->BufferFlags = (total < 0.0000001f) ?
		FAPO_BUFFER_SILENT :
		FAPO_BUFFER_VALID;

	FAPOBase_EndProcess(&fapo->base);
}